

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::add_training_vec
          (clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *v,uint weight)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar4;
  
  uVar3 = *(undefined8 *)v->m_s;
  uVar2 = (this->m_training_vecs).m_size;
  if ((this->m_training_vecs).m_capacity <= uVar2) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,uVar2 + 1,true,0xc,
               vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::object_mover,false);
  }
  ppVar4 = (this->m_training_vecs).m_p;
  uVar2 = (this->m_training_vecs).m_size;
  *(undefined8 *)ppVar4[uVar2].first.m_s = uVar3;
  ppVar4[uVar2].second = weight;
  puVar1 = &(this->m_training_vecs).m_size;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void add_training_vec(const VectorType& v, uint weight) {
    m_training_vecs.push_back(std::make_pair(v, weight));
  }